

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int gettime(float *elapse,float *elapscpu,int *status)

{
  int *in_RDX;
  float *in_RSI;
  float *in_RDI;
  long stopsec;
  int stopmilli;
  timeval tv;
  timeval local_28;
  int *local_18;
  float *local_10;
  float *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  ecpu = clock();
  *local_8 = (float)(local_28.tv_sec - startsec) +
             (float)((int)(local_28.tv_usec / 1000) - startmilli) / 1000.0;
  *local_10 = (float)(((double)(ecpu - scpu) * 1.0) / 1000000.0);
  return *local_18;
}

Assistant:

int gettime(float *elapse, float *elapscpu, int *status)
{
#if defined(unix) || defined(__unix__)  || defined(__unix)
        struct  timeval tv;
/*        struct  timezone tz; */
	int stopmilli;
	long stopsec;

/*        gettimeofday (&tv, &tz); */
        gettimeofday (&tv, NULL);
	ecpu = clock();

        stopmilli = tv.tv_usec/1000;
	stopsec = tv.tv_sec;
	
	*elapse = (stopsec - startsec) + (stopmilli - startmilli)/1000.;
	*elapscpu = (ecpu - scpu) * 1.0 / CLOCKTICKS;
/*
printf(" (start: %ld + %d), stop: (%ld + %d) elapse: %f\n ",
startsec,startmilli,stopsec, stopmilli, *elapse);
*/
#else
/* set the elapsed time the same as the CPU time on Windows machines */
	*elapscpu = (float) ((ecpu - scpu) * 1.0 / CLOCKTICKS);
	*elapse = *elapscpu;  
#endif
	return( *status );
}